

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfuda_cache.hpp
# Opt level: O0

size_t __thiscall
cappuccino::
lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_dynamic_age(lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                 *this,time_point now)

{
  bool bVar1;
  reference peVar2;
  pointer ppVar3;
  ulong uVar4;
  iterator iVar5;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_ffffffffffffff58;
  float local_9c;
  bool local_81;
  ulong local_58;
  size_t use_count;
  element *e;
  _List_const_iterator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_40;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  _Self local_30;
  age_iterator da_last;
  iterator da_start;
  size_t aged;
  lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point now_local;
  
  da_start._M_node = (_List_node_base *)0x0;
  this_local = (lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)now.__d.__r;
  da_last._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
       ::begin(&this->m_dynamic_age_list);
  local_30._M_node = (this->m_open_list_end)._M_node;
  while( true ) {
    bVar1 = std::operator!=(&da_last,&this->m_open_list_end);
    local_81 = false;
    if (bVar1) {
      peVar2 = std::
               _List_iterator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
               ::operator*(&da_last);
      local_38 = std::chrono::operator+(&peVar2->m_dynamic_age,&this->m_dynamic_age_tick);
      local_81 = std::chrono::operator<
                           (&local_38,
                            (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&this_local);
    }
    if (local_81 == false) break;
    bVar1 = std::operator!=(&da_last,&local_30);
    if (bVar1) {
      std::
      _List_const_iterator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
      ::_List_const_iterator(&local_40,&local_30);
      std::
      _List_const_iterator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
      ::_List_const_iterator
                ((_List_const_iterator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
                  *)&e,&da_last);
      std::__cxx11::
      list<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
      ::splice(&this->m_dynamic_age_list,(int)local_40._M_node,
               (__off64_t *)&this->m_dynamic_age_list,(int)e,in_R8,in_R9,in_stack_ffffffffffffff58);
    }
    use_count = (size_t)std::
                        _List_iterator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
                        ::operator*(&da_last);
    (((reference)use_count)->m_dynamic_age).__d.__r = (rep)this_local;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>
             ::operator->(&((reference)use_count)->m_lfu_position);
    local_58 = ppVar3->first;
    std::
    multimap<unsigned_long,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
    ::erase_abi_cxx11_((multimap<unsigned_long,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
                        *)&this->m_lfu_list,*(_Base_ptr *)(use_count + 8));
    local_9c = (float)local_58;
    local_9c = local_9c * this->m_dynamic_age_ratio;
    uVar4 = (ulong)local_9c;
    local_58 = uVar4 | (long)(local_9c - 9.223372e+18) & (long)uVar4 >> 0x3f;
    iVar5 = std::
            multimap<unsigned_long,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
            ::
            emplace<unsigned_long&,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>&>
                      ((multimap<unsigned_long,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
                        *)&this->m_lfu_list,&local_58,&da_last);
    *(_Base_ptr *)(use_count + 8) = iVar5._M_node;
    local_30._M_node = da_last._M_node;
    da_last._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
         ::begin(&this->m_dynamic_age_list);
    da_start._M_node = (_List_node_base *)((long)&(da_start._M_node)->_M_next + 1);
  }
  return (size_t)da_start._M_node;
}

Assistant:

auto do_dynamic_age(std::chrono::steady_clock::time_point now) -> size_t
    {
        size_t aged{0};

        // For all items in the DA list that are old enough and in use, DA them!
        auto da_start = m_dynamic_age_list.begin();
        auto da_last  = m_open_list_end; // need the item previous to the end to splice properly
        while (da_start != m_open_list_end && (*da_start).m_dynamic_age + m_dynamic_age_tick < now)
        {
            // swap to after the last item (if it isn't the last item..)
            if (da_start != da_last)
            {
                m_dynamic_age_list.splice(da_last, m_dynamic_age_list, da_start);
            }

            // Update its dynamic age time to now.
            element& e      = *da_start;
            e.m_dynamic_age = now;
            // Now *= ratio its use count to actually age it.  This requires
            // deleting from and re-inserting into the lfu data structure.
            size_t use_count = e.m_lfu_position->first;
            m_lfu_list.erase(e.m_lfu_position);
            use_count        = (size_t)(use_count * m_dynamic_age_ratio);
            e.m_lfu_position = m_lfu_list.emplace(use_count, da_start);

            // The last item is now this item!  This will maintain the insertion order.
            da_last = da_start;

            // Keep pruning from the beginning until we are m_open_list_end or not aged enough.
            da_start = m_dynamic_age_list.begin();
            ++aged;
        }

        return aged;
    }